

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchQbf.cpp
# Opt level: O3

void Bmatch_CreatePOMUXes(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Abc_Ntk_t *pNtk_Qbf)

{
  char cVar1;
  long *plVar2;
  Abc_Aig_t *pMan;
  bool bVar3;
  Abc_Obj_t *pC;
  Vec_Ptr_t *pVVar4;
  char *pcVar5;
  char *pName;
  Abc_Obj_t *pAVar6;
  long lVar7;
  ulong uVar8;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> Po_Pool;
  int level;
  Abc_Obj_t *pObjA;
  Abc_Obj_t *pObj;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> local_88;
  int local_6c;
  Abc_Ntk_t *local_68;
  Abc_Obj_t *local_60;
  Abc_Obj_t *local_58;
  Abc_Ntk_t *local_50;
  Abc_Obj_t_ *local_48;
  Abc_Obj_t *local_40;
  Abc_Ntk_t *local_38;
  
  local_6c = 1;
  local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_start = (Abc_Obj_t_ **)0x0;
  local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_finish = (Abc_Obj_t_ **)0x0;
  local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Abc_Obj_t_ **)0x0;
  local_68 = pNtk2;
  local_38 = pNtk_Qbf;
  if ((Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
       super__Vector_impl_data._M_start) &&
     (Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    pVVar4 = pNtk1->vPos;
    if (0 < pVVar4->nSize) {
      lVar7 = 0;
      do {
        plVar2 = (long *)pVVar4->pArray[lVar7];
        local_48 = (Abc_Obj_t_ *)
                   ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                   *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                       (long)*(int *)plVar2[4] * 8) + 0x40));
        std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::emplace_back<Abc_Obj_t_*>
                  ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&local_88,&local_48);
        lVar7 = lVar7 + 1;
        pVVar4 = pNtk1->vPos;
      } while (lVar7 < pVVar4->nSize);
    }
    pVVar4 = local_68->vPos;
    if (pVVar4->nSize < 1) {
      bVar3 = false;
    }
    else {
      lVar7 = 0;
      local_50 = pNtk_Qbf;
      do {
        local_40 = (Abc_Obj_t *)pVVar4->pArray[lVar7];
        Bmatch_Construct_MUXes(&local_88,&local_40,&local_38,&local_6c,&fConst0);
        local_6c = 1;
        lVar7 = lVar7 + 1;
        pVVar4 = local_68->vPos;
      } while (lVar7 < pVVar4->nSize);
      bVar3 = 0 < pVVar4->nSize;
      pNtk_Qbf = local_50;
    }
    if (local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    if (bVar3) {
      lVar7 = 0;
      do {
        plVar2 = (long *)pVVar4->pArray[lVar7];
        local_58 = Abc_AigXor((Abc_Aig_t *)pNtk_Qbf->pManFunc,(Abc_Obj_t *)plVar2[8],
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                  (long)*(int *)plVar2[4] * 8) + 0x40)));
        if (local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::_M_realloc_insert<Abc_Obj_t_*const&>
                    ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&local_88,
                     (iterator)
                     local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_58);
        }
        else {
          *local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_58;
          local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar7 = lVar7 + 1;
        pVVar4 = local_68->vPos;
      } while (lVar7 < pVVar4->nSize);
      if (local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar8 = 0;
        do {
          local_60 = Abc_NtkCreateObj(pNtk_Qbf,ABC_OBJ_PI);
          if ((long)local_68->vPos->nSize <= (long)uVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pcVar5 = Abc_ObjName((Abc_Obj_t *)local_68->vPos->pArray[uVar8]);
          pName = (char *)operator_new__(0x1e);
          lVar7 = 2;
          do {
            cVar1 = pcVar5[lVar7 + -2];
            pName[lVar7] = cVar1;
            lVar7 = lVar7 + 1;
          } while (cVar1 != '\0');
          pName[0] = 'y';
          pName[1] = '_';
          Abc_ObjAssignName(local_60,pName,"_*");
          operator_delete(pName,1);
          pC = local_60;
          pMan = (Abc_Aig_t *)pNtk_Qbf->pManFunc;
          pAVar6 = Abc_AigConst1(pNtk_Qbf);
          local_58 = Abc_AigMux(pMan,pC,(Abc_Obj_t *)((ulong)pAVar6 ^ 1),
                                local_88.
                                super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar8]);
          if (Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::
            _M_realloc_insert<Abc_Obj_t_*const&>
                      ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&Output_Pool,
                       (iterator)
                       Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_58);
          }
          else {
            *Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_58;
            Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          if (Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::
            _M_realloc_insert<Abc_Obj_t_*const&>
                      ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&Control_Pool,
                       (iterator)
                       Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_60);
          }
          else {
            *Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_60;
            Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)((long)local_88.
                                       super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_88.
                                       super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
    if (local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_start != (Abc_Obj_t_ **)0x0) {
      operator_delete(local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("Output_Pool.size() == 0 && Control_Pool.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchQbf.cpp"
                ,0xd2,"void Bmatch_CreatePOMUXes(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Bmatch_CreatePOMUXes( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Abc_Ntk_t * pNtk_Qbf )
{
    Abc_Obj_t * pPo, * pObj, * pObjA;
    int i, level = 1;
    char * pSuffix = new char[3]; pSuffix = "_*\0"; 
    vector< Abc_Obj_t * > Po_Pool;
    char * pName;

    assert( Output_Pool.size() == 0 && Control_Pool.size() == 0 );

    Abc_NtkForEachPo( pNtk1, pPo, i)
    {
        Po_Pool.push_back( Abc_ObjChild0Copy(pPo) );  
    }

    // Construct PO MUXes for Ntk2
    Abc_NtkForEachPo( pNtk2, pPo, i)
    {
        Bmatch_Construct_MUXes( Po_Pool, pPo, pNtk_Qbf, level );
        level = 1;
    }
    Po_Pool.clear();
    
    Abc_NtkForEachPo( pNtk2, pPo, i)
    {
        pObj = Abc_AigXor( (Abc_Aig_t *)pNtk_Qbf->pManFunc, pPo->pCopy, Abc_ObjChild0Copy(pPo) );
        Po_Pool.push_back( pObj );
    }

    for( int j = 0; j < Po_Pool.size(); ++j){
        pObjA = Abc_NtkCreatePi( pNtk_Qbf );

        pName = "y_";
        pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(Abc_NtkPo(pNtk2, j)));
        Abc_ObjAssignName( pObjA, pName, pSuffix );
        delete pName;

        pObj = Abc_AigMux( (Abc_Aig_t *)pNtk_Qbf->pManFunc, pObjA, Abc_ObjNot(Abc_AigConst1(pNtk_Qbf)), Po_Pool[j] );
        Output_Pool.push_back( pObj );
        Control_Pool.push_back( pObjA );
    }
}